

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O1

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,uint i)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  string __str;
  long *local_40;
  uint local_38;
  undefined4 uStack_34;
  long local_30 [2];
  
  cVar4 = '\x01';
  if (9 < i) {
    uVar2 = i;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar2 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001317ad;
      }
      if (uVar2 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001317ad;
      }
      if (uVar2 < 10000) goto LAB_001317ad;
      bVar1 = 99999 < uVar2;
      uVar2 = uVar2 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001317ad:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40,local_38,i);
  (*this->_vptr_Pipeline[2])(this,local_40,CONCAT44(uStack_34,local_38));
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(unsigned int i)
{
    this->writeString(std::to_string(i));
    return *this;
}